

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZconsStamp.cpp
# Opt level: O0

void __thiscall OpenMD::ZConsStamp::ZConsStamp(ZConsStamp *this)

{
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>
  __s;
  undefined1 uVar1;
  undefined8 *in_RDI;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>,_bool>
  pVar2;
  string *in_stack_fffffffffffffcb8;
  undefined7 in_stack_fffffffffffffcc0;
  undefined1 in_stack_fffffffffffffcc7;
  value_type *in_stack_fffffffffffffcc8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  *in_stack_fffffffffffffcd0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  *this_00;
  undefined7 in_stack_fffffffffffffcf0;
  undefined1 in_stack_fffffffffffffcf7;
  char *in_stack_fffffffffffffcf8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  allocator<char> local_239;
  string local_238 [79];
  allocator<char> local_1e9;
  string local_1e8 [32];
  _Base_ptr local_1c8;
  undefined1 local_1c0;
  undefined8 *local_1b8;
  allocator<char> local_1a9;
  string local_1a8 [79];
  allocator<char> local_159;
  string local_158 [32];
  _Base_ptr local_138;
  undefined1 local_130;
  undefined8 *local_128;
  allocator<char> local_119;
  string local_118 [79];
  allocator<char> local_c9;
  string local_c8 [32];
  _Base_ptr local_a8;
  undefined1 local_a0;
  undefined8 *local_98;
  allocator<char> local_89;
  string local_88 [79];
  allocator<char> local_39;
  string local_38 [56];
  
  DataHolder::DataHolder
            ((DataHolder *)CONCAT17(in_stack_fffffffffffffcc7,in_stack_fffffffffffffcc0));
  *in_RDI = &PTR__ZConsStamp_00502cd0;
  Parameter<int>::Parameter
            ((Parameter<int> *)CONCAT17(in_stack_fffffffffffffcc7,in_stack_fffffffffffffcc0));
  Parameter<double>::Parameter
            ((Parameter<double> *)CONCAT17(in_stack_fffffffffffffcc7,in_stack_fffffffffffffcc0));
  Parameter<double>::Parameter
            ((Parameter<double> *)CONCAT17(in_stack_fffffffffffffcc7,in_stack_fffffffffffffcc0));
  Parameter<double>::Parameter
            ((Parameter<double> *)CONCAT17(in_stack_fffffffffffffcc7,in_stack_fffffffffffffcc0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,
             (allocator<char> *)CONCAT17(in_stack_fffffffffffffcf7,in_stack_fffffffffffffcf0));
  ParameterBase::setKeyword
            ((ParameterBase *)CONCAT17(in_stack_fffffffffffffcc7,in_stack_fffffffffffffcc0),
             in_stack_fffffffffffffcb8);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator(&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,
             (allocator<char> *)CONCAT17(in_stack_fffffffffffffcf7,in_stack_fffffffffffffcf0));
  local_98 = in_RDI + 0xd;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_true>
            (in_stack_fffffffffffffcd0,&in_stack_fffffffffffffcc8->first,
             (ParameterBase **)CONCAT17(in_stack_fffffffffffffcc7,in_stack_fffffffffffffcc0));
  pVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
          ::insert((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
                    *)in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
  local_a8 = (_Base_ptr)pVar2.first._M_node;
  local_a0 = pVar2.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
           *)0x37c566);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator(&local_89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,
             (allocator<char> *)CONCAT17(in_stack_fffffffffffffcf7,in_stack_fffffffffffffcf0));
  ParameterBase::setKeyword
            ((ParameterBase *)CONCAT17(in_stack_fffffffffffffcc7,in_stack_fffffffffffffcc0),
             in_stack_fffffffffffffcb8);
  std::__cxx11::string::~string(local_c8);
  std::allocator<char>::~allocator(&local_c9);
  ParameterBase::setOptional((ParameterBase *)(in_RDI + 0x13),true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,
             (allocator<char> *)CONCAT17(in_stack_fffffffffffffcf7,in_stack_fffffffffffffcf0));
  local_128 = in_RDI + 0x13;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_true>
            (in_stack_fffffffffffffcd0,&in_stack_fffffffffffffcc8->first,
             (ParameterBase **)CONCAT17(in_stack_fffffffffffffcc7,in_stack_fffffffffffffcc0));
  pVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
          ::insert((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
                    *)in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
  local_138 = (_Base_ptr)pVar2.first._M_node;
  local_130 = pVar2.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
           *)0x37c6d0);
  std::__cxx11::string::~string(local_118);
  std::allocator<char>::~allocator(&local_119);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,
             (allocator<char> *)CONCAT17(in_stack_fffffffffffffcf7,in_stack_fffffffffffffcf0));
  ParameterBase::setKeyword
            ((ParameterBase *)CONCAT17(in_stack_fffffffffffffcc7,in_stack_fffffffffffffcc0),
             in_stack_fffffffffffffcb8);
  std::__cxx11::string::~string(local_158);
  std::allocator<char>::~allocator(&local_159);
  ParameterBase::setOptional((ParameterBase *)(in_RDI + 0x1a),true);
  this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RDI + 1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_01,in_stack_fffffffffffffcf8,
             (allocator<char> *)CONCAT17(in_stack_fffffffffffffcf7,in_stack_fffffffffffffcf0));
  local_1b8 = in_RDI + 0x1a;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_true>
            (in_stack_fffffffffffffcd0,&in_stack_fffffffffffffcc8->first,
             (ParameterBase **)CONCAT17(in_stack_fffffffffffffcc7,in_stack_fffffffffffffcc0));
  pVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
          ::insert((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
                    *)in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
  __s = pVar2.first._M_node;
  uVar1 = pVar2.second;
  local_1c8 = __s._M_node;
  local_1c0 = uVar1;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
           *)0x37c828);
  std::__cxx11::string::~string(local_1a8);
  std::allocator<char>::~allocator(&local_1a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_01,(char *)__s._M_node,
             (allocator<char> *)CONCAT17(uVar1,in_stack_fffffffffffffcf0));
  ParameterBase::setKeyword
            ((ParameterBase *)CONCAT17(in_stack_fffffffffffffcc7,in_stack_fffffffffffffcc0),
             in_stack_fffffffffffffcb8);
  std::__cxx11::string::~string(local_1e8);
  std::allocator<char>::~allocator(&local_1e9);
  ParameterBase::setOptional((ParameterBase *)(in_RDI + 0x21),true);
  this_00 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
             *)(in_RDI + 1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_01,(char *)__s._M_node,
             (allocator<char> *)CONCAT17(uVar1,in_stack_fffffffffffffcf0));
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_true>
            (this_00,&in_stack_fffffffffffffcc8->first,
             (ParameterBase **)CONCAT17(in_stack_fffffffffffffcc7,in_stack_fffffffffffffcc0));
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
  ::insert((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
            *)this_00,in_stack_fffffffffffffcc8);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
           *)0x37c980);
  std::__cxx11::string::~string(local_238);
  std::allocator<char>::~allocator(&local_239);
  return;
}

Assistant:

ZConsStamp::ZConsStamp() {
    DefineParameter(MolIndex, "molIndex");
    DefineOptionalParameter(Zpos, "zPos");
    DefineOptionalParameter(Kratio, "kRatio");
    DefineOptionalParameter(CantVel, "cantVel");
  }